

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
mxx::impl::
split<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,impl *this,
          long begin,long *end,long param_5)

{
  ulong uVar1;
  unsigned_long uVar2;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  pVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *send_counts;
  int rank;
  allocator_type local_61;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  long local_58;
  value_type_conflict2 local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  local_60 = __return_storage_ptr__;
  local_58 = begin;
  if (end[1] - *end >> 2 != (long)*(int *)(param_5 + 0x10) + -1) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_50);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",local_50 & 0xffffffff,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
           ,0xe9,"split","splitters.size() == (size_t)comm.size() - 1");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  local_50 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (local_60,(long)*(int *)(param_5 + 0x10),&local_50,&local_61);
  local_48 = local_58 - (long)this >> 2;
  lVar6 = *end;
  local_40 = param_5;
  if (end[1] - lVar6 != 0) {
    uVar5 = end[1] - lVar6 >> 2;
    local_38 = (ulong)*(int *)(param_5 + 0x10);
    uVar4 = 0;
    _Var7._M_current = (int *)this;
    do {
      uVar11 = uVar4 + 1;
      uVar12 = 1;
      if (uVar11 < uVar5) {
        uVar13 = 1;
        do {
          uVar12 = (uint)uVar13;
          if (*(int *)(lVar6 + uVar4 * 4) < *(int *)(lVar6 + uVar11 * 4)) break;
          uVar12 = uVar12 + 1;
          uVar13 = (ulong)uVar12;
          uVar11 = uVar4 + uVar13;
        } while (uVar11 < uVar5);
      }
      pVar14 = std::
               __equal_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int,__gnu_cxx::__ops::_Iter_comp_val<std::less<int>>,__gnu_cxx::__ops::_Val_comp_iter<std::less<int>>>
                         (_Var7._M_current,local_58,lVar6 + uVar4 * 4);
      this = (impl *)pVar14.second._M_current;
      puVar3 = (local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start;
      uVar2 = ((long)pVar14.first._M_current._M_current - (long)_Var7._M_current >> 2) +
              puVar3[uVar4];
      puVar3[uVar4] = uVar2;
      uVar5 = (long)this - (long)pVar14.first._M_current >> 2;
      if (uVar12 != 0) {
        uVar13 = (uVar2 + uVar5) / (ulong)(uVar12 + 1) + 1;
        lVar6 = uVar4 << 0x20;
        uVar10 = 0;
        do {
          uVar1 = puVar3[uVar4 + uVar10];
          uVar8 = local_48 / local_38 + (ulong)((ulong)(lVar6 >> 0x20) < local_48 % local_38);
          uVar9 = uVar8 - uVar1;
          if (uVar8 < uVar1 || uVar9 == 0) {
            uVar9 = 0;
          }
          else {
            if (uVar9 <= uVar13) {
              uVar9 = uVar13;
            }
            if (uVar5 < uVar9) {
              uVar9 = uVar5;
            }
            uVar5 = uVar5 - uVar9;
          }
          puVar3[uVar4 + uVar10] = uVar9 + uVar1;
          uVar10 = uVar10 + 1;
          lVar6 = lVar6 + 0x100000000;
        } while (uVar12 != uVar10);
      }
      puVar3[uVar11] = puVar3[uVar11] + uVar5;
      lVar6 = *end;
      uVar5 = end[1] - lVar6 >> 2;
      uVar4 = uVar11;
      _Var7._M_current = (int *)this;
    } while (uVar11 < uVar5);
  }
  puVar3 = (local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3[(long)*(int *)(local_40 + 0x10) + -1] =
       puVar3[(long)*(int *)(local_40 + 0x10) + -1] + (local_58 - (long)this >> 2);
  uVar4 = 0;
  for (; puVar3 != (local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
    uVar4 = uVar4 + *puVar3;
  }
  if (uVar4 != local_48) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_50);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",local_50 & 0xffffffff,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
           ,0x114,"split",
           "std::accumulate(send_counts.begin(), send_counts.end(), 0ull) == local_size");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  return local_60;
}

Assistant:

std::vector<size_t> split(_Iterator begin, _Iterator end, _Compare comp, const std::vector<typename std::iterator_traits<_Iterator>::value_type>& splitters, const mxx::comm& comm) {
    // 5. locally find splitter positions in data
    //    (if an identical splitter appears at least three times (or more),
    //    then split the intermediary buckets evenly) => send_counts
    MXX_ASSERT(splitters.size() == (size_t)comm.size() - 1);
    std::vector<size_t> send_counts(comm.size(), 0);
    _Iterator pos = begin;
    size_t local_size = std::distance(begin, end);
    partition::block_decomposition<std::size_t> local_part(local_size, comm.size(), comm.rank());
    for (std::size_t i = 0; i < splitters.size();) {
        // get the number of splitters which are equal starting from `i`
        unsigned int split_by = 1;
        while (i+split_by < splitters.size()
               && !comp(splitters[i], splitters[i+split_by])) {
            ++split_by;
        }

        // get the range of equal elements
        std::pair<_Iterator, _Iterator> eqr = std::equal_range(pos, end, splitters[i], comp);

        // assign smaller elements to processor left of splitter (= `i`)
        send_counts[i] += std::distance(pos, eqr.first);
        pos = eqr.first;

        // split equal elements fairly across processors
        std::size_t eq_size = std::distance(pos, eqr.second);
        // try to split approx equal:
        std::size_t eq_size_split = (eq_size + send_counts[i]) / (split_by+1) + 1;
        for (unsigned int j = 0; j < split_by; ++j) {
            // TODO: this kind of splitting is not `stable` (need other strategy
            // to mak such splitting stable across processors)
            std::size_t out_size = 0;
            if (send_counts[i+j] < local_part.local_size(i+j)) {
                // try to distribute fairly
                out_size = std::min(std::max(local_part.local_size(i+j) - send_counts[i+j], eq_size_split), eq_size);
                eq_size -= out_size;
            }
            send_counts[i+j] += out_size;
        }
        // assign remaining elements to next processor
        send_counts[i+split_by] += eq_size;
        i += split_by;
        pos = eqr.second;
    }
    // send last elements to last processor
    std::size_t out_size = std::distance(pos, end);
    send_counts[comm.size() - 1] += out_size;
    MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), 0ull) == local_size);
    return send_counts;
}